

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_gentm.cc
# Opt level: O3

int ASN1_GENERALIZEDTIME_set_string(ASN1_GENERALIZEDTIME *s,char *str)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  CBS cbs;
  CBS local_30;
  
  sVar2 = strlen(str);
  iVar3 = 0;
  local_30.data = (uint8_t *)str;
  local_30.len = sVar2;
  iVar1 = CBS_parse_generalized_time(&local_30,(tm *)0x0,0);
  if (iVar1 != 0) {
    if (s != (ASN1_GENERALIZEDTIME *)0x0) {
      iVar1 = ASN1_STRING_set(s,str,(int)sVar2);
      if (iVar1 == 0) {
        return 0;
      }
      s->type = 0x18;
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int ASN1_GENERALIZEDTIME_set_string(ASN1_GENERALIZEDTIME *s, const char *str) {
  size_t len = strlen(str);
  CBS cbs;
  CBS_init(&cbs, (const uint8_t *)str, len);
  if (!CBS_parse_generalized_time(&cbs, /*out_tm=*/NULL,
                                  /*allow_timezone_offset=*/0)) {
    return 0;
  }
  if (s != NULL) {
    if (!ASN1_STRING_set(s, str, len)) {
      return 0;
    }
    s->type = V_ASN1_GENERALIZEDTIME;
  }
  return 1;
}